

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

int __thiscall miniros::TransportTCP::listen(TransportTCP *this,int __fd,int __n)

{
  sockaddr_storage *__addr;
  ushort uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  sa_family_t sVar6;
  undefined4 uVar7;
  function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)> *in_RCX;
  undefined8 *puVar8;
  socklen_t __len;
  Level level;
  void *logger_handle;
  char *fmt;
  allocator<char> local_41;
  string local_40;
  
  this->is_server_ = true;
  std::function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)>::operator=
            (&this->accept_cb_,in_RCX);
  if (s_use_ipv6_ == '\x01') {
    iVar4 = socket(10,1,0);
    if ((this->super_Transport).only_localhost_allowed_ == false) {
      puVar8 = (undefined8 *)&in6addr_any;
    }
    else {
      puVar8 = (undefined8 *)&in6addr_loopback;
    }
    uVar2 = puVar8[1];
    *(undefined8 *)((this->server_address_).__ss_padding + 6) = *puVar8;
    *(undefined8 *)((this->server_address_).__ss_padding + 0xe) = uVar2;
    __len = 0x1c;
    sVar6 = 10;
  }
  else {
    iVar4 = socket(2,1,0);
    uVar7 = 0x100007f;
    if ((this->super_Transport).only_localhost_allowed_ == false) {
      uVar7 = 0;
    }
    *(undefined4 *)((this->server_address_).__ss_padding + 2) = uVar7;
    __len = 0x10;
    sVar6 = 2;
  }
  this->sock_ = iVar4;
  (this->server_address_).ss_family = sVar6;
  *(ushort *)(this->server_address_).__ss_padding = (ushort)__fd << 8 | (ushort)__fd >> 8;
  this->sa_len_ = __len;
  if (iVar4 == -1) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (listen::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"miniros.transport_tcp",&local_41);
      console::initializeLogLocation(&listen::loc,&local_40,Error);
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (listen::loc.level_ != Error) {
      console::setLogLocationLevel(&listen::loc,Error);
      console::checkLogLocationEnabled(&listen::loc);
    }
    logger_handle = listen::loc.logger_;
    level = listen::loc.level_;
    if (listen::loc.logger_enabled_ == true) {
      pcVar5 = last_socket_error_string();
      fmt = "socket() failed with error [%s]";
      iVar4 = 0x193;
LAB_002665ec:
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,iVar4,"bool miniros::TransportTCP::listen(int, int, const AcceptCallback &)",
                     fmt,pcVar5);
      return 0;
    }
  }
  else {
    __addr = &this->server_address_;
    iVar4 = bind(iVar4,(sockaddr *)__addr,__len);
    if (iVar4 < 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"miniros.transport_tcp",&local_41);
        console::initializeLogLocation
                  (&listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
                    ::loc,&local_40,Error);
        std::__cxx11::string::~string((string *)&local_40);
      }
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.level_ != Error) {
        console::setLogLocationLevel
                  (&listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
                    ::loc,Error);
        console::checkLogLocationEnabled
                  (&listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
                    ::loc);
      }
      logger_handle =
           listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
           loc.logger_;
      level = listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
              ::loc.level_;
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.logger_enabled_ == true) {
        pcVar5 = last_socket_error_string();
        fmt = "bind() failed with error [%s]";
        iVar4 = 0x19a;
        goto LAB_002665ec;
      }
    }
    else {
      ::listen(this->sock_,__n);
      getsockname(this->sock_,(sockaddr *)__addr,&this->sa_len_);
      if (((this->server_address_).ss_family | 8) == 10) {
        uVar1 = *(ushort *)(this->server_address_).__ss_padding;
        this->server_port_ = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
      }
      bVar3 = initializeSocket(this);
      if (bVar3) {
        iVar4 = (int)CONCAT71((int7)((ulong)__addr >> 8),1);
        if ((this->flags_ & 1) != 0) {
          return iVar4;
        }
        (*(this->super_Transport)._vptr_Transport[6])(this);
        return iVar4;
      }
    }
  }
  return 0;
}

Assistant:

bool TransportTCP::listen(int port, int backlog, const AcceptCallback& accept_cb)
{
  is_server_ = true;
  accept_cb_ = accept_cb;

  if (s_use_ipv6_)
  {
    sock_ = socket(AF_INET6, SOCK_STREAM, 0);
    sockaddr_in6 *address = (sockaddr_in6 *)&server_address_;
    address->sin6_family = AF_INET6;
    address->sin6_addr = isOnlyLocalhostAllowed() ? 
                         in6addr_loopback : 
                         in6addr_any;
    address->sin6_port = htons(port);
    sa_len_ = sizeof(sockaddr_in6);
  }
  else
  {
    sock_ = socket(AF_INET, SOCK_STREAM, 0);
    sockaddr_in *address = (sockaddr_in *)&server_address_;
    address->sin_family = AF_INET;
    address->sin_addr.s_addr = isOnlyLocalhostAllowed() ? 
                               htonl(INADDR_LOOPBACK) : 
                               INADDR_ANY;
    address->sin_port = htons(port);
    sa_len_ = sizeof(sockaddr_in);
  }

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]", last_socket_error_string());
    return false;
  }


  if (bind(sock_, (sockaddr *)&server_address_, sa_len_) < 0)
  {
    MINIROS_ERROR("bind() failed with error [%s]", last_socket_error_string());
    return false;
  }

  ::listen(sock_, backlog);
  getsockname(sock_, (sockaddr *)&server_address_, &sa_len_);

  switch (server_address_.ss_family)
  {
    case AF_INET:
      server_port_ = ntohs(((sockaddr_in *)&server_address_)->sin_port);
      break;
    case AF_INET6:
      server_port_ = ntohs(((sockaddr_in6 *)&server_address_)->sin6_port);
      break;
  }

  if (!initializeSocket())
  {
    return false;
  }

  if (!(flags_ & SYNCHRONOUS))
  {
    enableRead();
  }

  return true;
}